

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_dbg.c
# Opt level: O0

ecs_type_t ecs_dbg_get_column_type(ecs_world_t *world,ecs_entity_t system,int32_t column_index)

{
  int32_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  ecs_world_t *local_58;
  ecs_type_t result;
  ecs_sig_oper_kind_t oper_kind;
  ecs_sig_column_t *column;
  int32_t count;
  ecs_sig_column_t *columns;
  EcsSystem *system_data;
  int32_t column_index_local;
  ecs_entity_t system_local;
  ecs_world_t *world_local;
  
  pvVar2 = ecs_get_w_entity(world,system,5);
  if (pvVar2 == (void *)0x0) {
    world_local = (ecs_world_t *)0x0;
  }
  else {
    pvVar3 = _ecs_vector_first(*(ecs_vector_t **)(*(long *)((long)pvVar2 + 0x18) + 0x10),0x28,0x10);
    iVar1 = ecs_vector_count(*(ecs_vector_t **)(*(long *)((long)pvVar2 + 0x18) + 0x10));
    if (iVar1 < column_index) {
      world_local = (ecs_world_t *)0x0;
    }
    else {
      iVar4 = column_index + -1;
      if (*(int *)((long)pvVar3 + (long)iVar4 * 0x28 + 4) == 1) {
        local_58 = *(ecs_world_t **)((long)pvVar3 + (long)iVar4 * 0x28 + 0x10);
      }
      else {
        local_58 = (ecs_world_t *)
                   ecs_type_from_entity
                             (world,*(ecs_entity_t *)((long)pvVar3 + (long)iVar4 * 0x28 + 0x10));
      }
      world_local = local_58;
    }
  }
  return (ecs_type_t)world_local;
}

Assistant:

ecs_type_t ecs_dbg_get_column_type(
    ecs_world_t *world,
    ecs_entity_t system,
    int32_t column_index)
{
    const EcsSystem *system_data = ecs_get(world, system, EcsSystem);
    if (!system_data) {
        return NULL;
    }
    
    ecs_sig_column_t *columns = ecs_vector_first(
        system_data->query->sig.columns, ecs_sig_column_t);
    int32_t count = ecs_vector_count(system_data->query->sig.columns);

    if (count < column_index) {
        return NULL;
    }

    ecs_sig_column_t *column = &columns[column_index - 1];
    ecs_sig_oper_kind_t oper_kind = column->oper_kind;
    ecs_type_t result;

    switch(oper_kind) {
    case EcsOperOr:
        result = column->is.type;
        break;
    default:
        result = ecs_type_from_entity(world, column->is.component);
        break;
    }
    
    return result;
}